

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O1

LispPTR N_OP_boxidiff(LispPTR a,LispPTR tos)

{
  uint uVar1;
  
  if ((*(ushort *)((ulong)(MDStypetbl + (a >> 9)) ^ 2) & 0x7ff) == 2) {
    if ((tos & 0xfff0000) == 0xf0000) {
      uVar1 = tos | 0xffff0000;
    }
    else if ((tos & 0xfff0000) == 0xe0000) {
      uVar1 = tos & 0xffff;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_0010816b;
      if ((tos & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)tos);
      }
      uVar1 = *(uint *)(Lisp_world + tos);
    }
    if ((a & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)a);
    }
    *(uint *)(Lisp_world + a) = *(int *)(Lisp_world + a) - uVar1;
  }
  else {
LAB_0010816b:
    MachineState.errorexit = 1;
    a = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return a;
}

Assistant:

LispPTR N_OP_boxidiff(LispPTR a, LispPTR tos) {
  int arg2;

  if (GetTypeNumber(a) == TYPE_FIXP) {
    N_GETNUMBER(tos, arg2, bad);
    *((int *)NativeAligned4FromLAddr(a)) -= arg2;
    return (a);
  }
bad:
  ERROR_EXIT(tos);

}